

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cpp
# Opt level: O3

string * duckdb::PrettyPrintString(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  string *extraout_RAX;
  string *psVar4;
  size_type sVar5;
  char cVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_63f17de + 9);
  sVar2 = s->_M_string_length;
  psVar4 = extraout_RAX;
  if (sVar2 != 0) {
    pcVar3 = (s->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      cVar6 = (char)__return_storage_ptr__;
      if ((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
         ((bVar1 - 0x20 < 0x40 && ((0x8000000000006001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) != 0)
          ))) {
        psVar4 = (string *)::std::__cxx11::string::push_back(cVar6);
      }
      else {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::push_back(cVar6);
        psVar4 = (string *)::std::__cxx11::string::push_back(cVar6);
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return psVar4;
}

Assistant:

static string PrettyPrintString(const string &s) {
	string res = "";
	for (auto c : s) {
		if (StringUtil::CharacterIsAlpha(c) || StringUtil::CharacterIsDigit(c) || c == '_' || c == '-' || c == ' ' ||
		    c == '.') {
			res += c;
		} else {
			auto value = UnsafeNumericCast<uint8_t>(c);
			res += "\\x";
			uint8_t first = value / 16;
			if (first < 10) {
				res.push_back((char)('0' + first));
			} else {
				res.push_back((char)('a' + first - 10));
			}
			uint8_t second = value % 16;
			if (second < 10) {
				res.push_back((char)('0' + second));
			} else {
				res.push_back((char)('a' + second - 10));
			}
		}
	}
	return res;
}